

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_murmurhash.c
# Opt level: O0

uint32_t ngx_murmur_hash2(u_char *data,size_t len)

{
  uint uVar1;
  undefined4 local_1c;
  uint32_t k;
  uint32_t h;
  size_t len_local;
  u_char *data_local;
  
  local_1c = (uint)len;
  len_local = (size_t)data;
  for (_k = len; 3 < _k; _k = _k - 4) {
    local_1c = ((uint)(*(int *)len_local * 0x5bd1e995) >> 0x18 ^ *(int *)len_local * 0x5bd1e995) *
               0x5bd1e995 ^ local_1c * 0x5bd1e995;
    len_local = len_local + 4;
  }
  if (_k != 1) {
    if (_k != 2) {
      if (_k != 3) goto LAB_00124af0;
      local_1c = (uint)*(byte *)(len_local + 2) << 0x10 ^ local_1c;
    }
    local_1c = (uint)*(byte *)(len_local + 1) << 8 ^ local_1c;
  }
  local_1c = (*(byte *)len_local ^ local_1c) * 0x5bd1e995;
LAB_00124af0:
  uVar1 = (local_1c >> 0xd ^ local_1c) * 0x5bd1e995;
  return uVar1 >> 0xf ^ uVar1;
}

Assistant:

uint32_t
ngx_murmur_hash2(u_char *data, size_t len)
{
    uint32_t  h, k;

    h = 0 ^ len;

    while (len >= 4) {
        k  = data[0];
        k |= data[1] << 8;
        k |= data[2] << 16;
        k |= data[3] << 24;

        k *= 0x5bd1e995;
        k ^= k >> 24;
        k *= 0x5bd1e995;

        h *= 0x5bd1e995;
        h ^= k;

        data += 4;
        len -= 4;
    }

    switch (len) {
    case 3:
        h ^= data[2] << 16;
        /* fall through */
    case 2:
        h ^= data[1] << 8;
        /* fall through */
    case 1:
        h ^= data[0];
        h *= 0x5bd1e995;
    }

    h ^= h >> 13;
    h *= 0x5bd1e995;
    h ^= h >> 15;

    return h;
}